

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O2

void __thiscall cmCTestLaunch::LoadConfig(cmCTestLaunch *this)

{
  bool bVar1;
  string *path;
  string fname;
  undefined1 local_17d8 [48];
  cmAlphaNum local_17a8;
  cmMakefile mf;
  cmake cm;
  cmGlobalGenerator gg;
  
  cmake::cmake(&cm,RoleScript,CTest,Normal);
  std::__cxx11::string::string<std::allocator<char>>((string *)&mf,"",(allocator<char> *)&gg);
  cmake::SetHomeDirectory(&cm,(string *)&mf);
  std::__cxx11::string::~string((string *)&mf);
  std::__cxx11::string::string<std::allocator<char>>((string *)&mf,"",(allocator<char> *)&gg);
  cmake::SetHomeOutputDirectory(&cm,(string *)&mf);
  std::__cxx11::string::~string((string *)&mf);
  mf.FindPackageRootPathStack.
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur =
       (_Elt_pointer)cm.CurrentSnapshot.Position.Position;
  mf.FindPackageRootPathStack.
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)cm.CurrentSnapshot.State;
  mf.FindPackageRootPathStack.
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = (size_t)cm.CurrentSnapshot.Position.Tree;
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&mf);
  cmGlobalGenerator::cmGlobalGenerator(&gg,&cm);
  local_17d8._16_8_ = cm.CurrentSnapshot.Position.Position;
  local_17d8._0_8_ = cm.CurrentSnapshot.State;
  local_17d8._8_8_ = cm.CurrentSnapshot.Position.Tree;
  cmMakefile::cmMakefile(&mf,&gg,(cmStateSnapshot *)local_17d8);
  local_17d8._8_8_ = (this->Reporter).LogDir._M_dataplus._M_p;
  local_17d8._0_8_ = (this->Reporter).LogDir._M_string_length;
  local_17a8.View_._M_len = 0x17;
  local_17a8.View_._M_str = "CTestLaunchConfig.cmake";
  cmStrCat<>(&fname,(cmAlphaNum *)local_17d8,&local_17a8);
  bVar1 = cmsys::SystemTools::FileExists(&fname);
  if (bVar1) {
    bVar1 = cmMakefile::ReadListFile(&mf,&fname);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_17d8,"CTEST_SOURCE_DIRECTORY",(allocator<char> *)&local_17a8);
      cmMakefile::GetSafeDefinition(&mf,(string *)local_17d8);
      path = &(this->Reporter).SourceDir;
      std::__cxx11::string::_M_assign((string *)path);
      std::__cxx11::string::~string((string *)local_17d8);
      cmsys::SystemTools::ConvertToUnixSlashes(path);
    }
  }
  std::__cxx11::string::~string((string *)&fname);
  cmMakefile::~cmMakefile(&mf);
  cmGlobalGenerator::~cmGlobalGenerator(&gg);
  cmake::~cmake(&cm);
  return;
}

Assistant:

void cmCTestLaunch::LoadConfig()
{
  cmake cm(cmake::RoleScript, cmState::CTest);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator gg(&cm);
  cmMakefile mf(&gg, cm.GetCurrentSnapshot());
  std::string fname =
    cmStrCat(this->Reporter.LogDir, "CTestLaunchConfig.cmake");
  if (cmSystemTools::FileExists(fname) && mf.ReadListFile(fname)) {
    this->Reporter.SourceDir = mf.GetSafeDefinition("CTEST_SOURCE_DIRECTORY");
    cmSystemTools::ConvertToUnixSlashes(this->Reporter.SourceDir);
  }
}